

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O1

string * __thiscall helics::Input::getPublicationType_abi_cxx11_(Input *this)

{
  DataType type;
  Core *pCVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  string *psVar3;
  string *psVar4;
  undefined4 extraout_var;
  undefined8 in_RDX;
  
  type = this->injectionType;
  if (type == HELICS_CUSTOM) {
    pCVar1 = (this->super_Interface).mCore;
    UNRECOVERED_JUMPTABLE = pCVar1->_vptr_Core[0x2c];
    iVar2 = (*UNRECOVERED_JUMPTABLE)
                      (pCVar1,(ulong)(uint)(this->super_Interface).handle.hid,in_RDX,
                       UNRECOVERED_JUMPTABLE);
    return (string *)CONCAT44(extraout_var,iVar2);
  }
  if (type == HELICS_UNKNOWN) {
    psVar3 = Interface::getInjectionType_abi_cxx11_(&this->super_Interface);
    return (string *)psVar3;
  }
  psVar4 = typeNameStringRef_abi_cxx11_(type);
  return psVar4;
}

Assistant:

const std::string& getPublicationType() const
    {
        return ((injectionType == DataType::HELICS_UNKNOWN) ||
                (injectionType == DataType::HELICS_CUSTOM)) ?
            getInjectionType() :
            typeNameStringRef(injectionType);
    }